

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klogic.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
klogic::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,
                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v)

{
  ostream *poVar1;
  complex *pcVar2;
  char local_1a [2];
  
  local_1a[0] = '[';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_1a,1);
  for (pcVar2 = (complex *)
                (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 != (complex *)
                (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 0x10) {
    std::operator<<((ostream *)os,pcVar2);
  }
  local_1a[1] = 0x5d;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_1a + 1,1);
  return (basic_ostream<char,_std::char_traits<char>_> *)poVar1;
}

Assistant:

Stream &operator<<(Stream& os, const std::vector<T> &v) {
        os << '[';
        for (typename std::vector<T>::const_iterator i = v.begin(); i != v.end(); ++i) {
            os << *i;
        }
        return os << ']';
    }